

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldiv.c
# Opt level: O0

int main(void)

{
  ldiv_t lVar1;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  ldiv_t result;
  
  lVar1 = ldiv(5,2);
  local_30 = lVar1.quot;
  local_28 = lVar1.rem;
  if ((local_30 != 2) || (local_28 != 1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/ldiv.c, line %d - %s\n"
           ,0x1e,"result.quot == 2 && result.rem == 1");
  }
  lVar1 = ldiv(-5,2);
  local_40 = lVar1.quot;
  local_38 = lVar1.rem;
  if ((local_40 != -2) || (local_38 != -1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/ldiv.c, line %d - %s\n"
           ,0x20,"result.quot == -2 && result.rem == -1");
  }
  lVar1 = ldiv(5,-2);
  local_50 = lVar1.quot;
  local_48 = lVar1.rem;
  if ((local_50 != -2) || (local_48 != 1)) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/ldiv.c, line %d - %s\n"
           ,0x22,"result.quot == -2 && result.rem == 1");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    ldiv_t result;
    result = ldiv( 5, 2 );
    TESTCASE( result.quot == 2 && result.rem == 1 );
    result = ldiv( -5, 2 );
    TESTCASE( result.quot == -2 && result.rem == -1 );
    result = ldiv( 5, -2 );
    TESTCASE( result.quot == -2 && result.rem == 1 );
    TESTCASE( sizeof( result.quot ) == sizeof( long ) );
    TESTCASE( sizeof( result.rem )  == sizeof( long ) );
    return TEST_RESULTS;
}